

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O3

reentrant_put_transaction<void> *
density_tests::detail::
PutInt<density::lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
::reentrant_put(reentrant_put_transaction<void> *__return_storage_ptr__,
               conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
               *i_queue,EasyRandom *param_2)

{
  int local_5c;
  LfQueueControl *local_58;
  uintptr_t uStack_50;
  void *local_48;
  conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
  *local_40;
  reentrant_put_transaction<int> local_38;
  
  local_5c = 1;
  density::
  lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
  ::start_reentrant_emplace<int,int>
            (&local_38,
             (lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
              *)i_queue,&local_5c);
  local_58 = local_38.m_put.m_control_block;
  uStack_50 = local_38.m_put.m_next_ptr;
  local_48 = local_38.m_put.m_user_storage;
  local_40 = local_38.m_queue;
  exception_checkpoint();
  (__return_storage_ptr__->m_put).m_user_storage = local_48;
  (__return_storage_ptr__->m_put).m_control_block = local_58;
  (__return_storage_ptr__->m_put).m_next_ptr = uStack_50;
  __return_storage_ptr__->m_queue = local_38.m_queue;
  return __return_storage_ptr__;
}

Assistant:

static typename QUEUE::template reentrant_put_transaction<void>
              reentrant_put(QUEUE & i_queue, EasyRandom &)
            {
                auto transaction = i_queue.start_reentrant_push(1);
                exception_checkpoint();
                return std::move(transaction);
            }